

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

string * tinyusdz::io::JoinPath(string *__return_storage_ptr__,string *dir,string *filename)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  reference pcVar4;
  long lVar5;
  allocator local_101;
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string basedir;
  char lastChar;
  string *filename_local;
  string *dir_local;
  
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    ::std::__cxx11::string::rbegin();
    pcVar4 = ::std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&basedir.field_2 + 8));
    cVar1 = *pcVar4;
    ::std::__cxx11::string::string((string *)local_50);
    if (cVar1 == '/') {
      ::std::__cxx11::string::operator=((string *)local_50,(string *)dir);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_90,"/",&local_91);
      ::std::operator+(&local_70,dir,&local_90);
      ::std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    lVar5 = ::std::__cxx11::string::size();
    if (lVar5 == 0) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"./",&local_b9);
      bVar2 = startsWith((string *)filename,(string *)local_b8);
      ::std::__cxx11::string::~string(local_b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_100,"./",&local_101);
        removePrefix((tinyusdz *)&local_e0,(string *)filename,(string *)local_100);
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,&local_e0);
        ::std::__cxx11::string::~string((string *)&local_e0);
        ::std::__cxx11::string::~string(local_100);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
      }
      else {
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
      }
    }
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinPath(const std::string &dir, const std::string &filename) {
  if (dir.empty()) {
    return filename;
  } else {
    // check '/'
    char lastChar = *dir.rbegin();

    // TODO: Support more relative path case.

    std::string basedir;
    if (lastChar != '/') {
      basedir = dir + std::string("/");
    } else {
      basedir = dir;
    }

    if (basedir.size()) {
      if (startsWith(filename, "./")) {
        // strip "./"
        return basedir + removePrefix(filename, "./");
      }
      return basedir + filename;
    } else {
      return filename;
    }
  }
}